

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::
concat<kj::_::Delimited<kj::ArrayPtr<int_const>>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<int_const>>>
          (String *__return_storage_ptr__,_ *this,Delimited<kj::ArrayPtr<const_int>_> *params,
          StringPtr *params_1,Delimited<kj::ArrayPtr<const_int>_> *params_2)

{
  long lVar1;
  size_t size;
  char *target;
  size_t local_38 [3];
  
  local_38[0] = Delimited<kj::ArrayPtr<const_int>_>::size
                          ((Delimited<kj::ArrayPtr<const_int>_> *)this);
  local_38[1] = (params->array).size_ - 1;
  local_38[2] = Delimited<kj::ArrayPtr<const_int>_>::size
                          ((Delimited<kj::ArrayPtr<const_int>_> *)params_1);
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_38 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<int_const>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<int_const>>>
            (target,(Delimited<kj::ArrayPtr<const_int>_> *)this,(StringPtr *)params,
             (Delimited<kj::ArrayPtr<const_int>_> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}